

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::createTexture
          (ImageLoadStoreEarlyFragmentTestsTest *this)

{
  GLenum GVar1;
  ImageLoadStoreEarlyFragmentTestsTest *this_local;
  
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_texture_id);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  glu::checkError(GVar1,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2763);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,this->m_texture_id);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  glu::checkError(GVar1,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2766);
  glu::CallLogWrapper::glTexStorage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,1,0x822e,this->m_image_edge,this->m_image_edge);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  glu::checkError(GVar1,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2769);
  return;
}

Assistant:

void createTexture()
	{
		glGenTextures(1, &m_texture_id);
		GLU_EXPECT_NO_ERROR(glGetError(), "GenTextures");

		glBindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(glGetError(), "BindTexture");

		glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32F, m_image_edge, m_image_edge);
		GLU_EXPECT_NO_ERROR(glGetError(), "TexStorage2D");
	}